

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cc
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 __s;
  int iVar1;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *f;
  char *local_118;
  char *local_110;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  string result;
  string local_b8;
  string local_98;
  string local_68;
  undefined1 local_48 [8];
  string src_data;
  char *dst_filename;
  char *src_filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    local_110 = (char *)0x0;
  }
  else {
    local_110 = argv[1];
  }
  if (argc < 3) {
    local_118 = (char *)0x0;
  }
  else {
    local_118 = argv[2];
  }
  src_data.field_2._8_8_ = local_118;
  if (argc < 4) {
    std::__cxx11::string::string((string *)local_48);
    f = extraout_RDX;
    if ((local_110 == (char *)0x0) ||
       (iVar1 = strcmp(local_110,"-"), f = extraout_RDX_00, iVar1 == 0)) {
      phosg::read_all_abi_cxx11_(&local_68,_stdin,f);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,local_110,
                 (allocator<char> *)(result.field_2._M_local_buf + 0xf));
      phosg::load_file(&local_98,&local_b8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)(result.field_2._M_local_buf + 0xf));
    }
    phosg::parse_data_string((string *)local_e0,(string *)local_48,(string *)0x0,0);
    if ((src_data.field_2._8_8_ == 0) ||
       (iVar1 = strcmp((char *)src_data.field_2._8_8_,"-"), __s = src_data.field_2._8_8_, iVar1 == 0
       )) {
      phosg::fwritex(_stdout,(string *)local_e0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,(char *)__s,&local_101);
      phosg::save_file(&local_100,(string *)local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_48);
    return 0;
  }
  fprintf(_stderr,"too many positional arguments given\n");
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  string src_data;
  if (!src_filename || !strcmp(src_filename, "-")) {
    src_data = read_all(stdin);
  } else {
    src_data = load_file(src_filename);
  }

  string result = parse_data_string(src_data);

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    fwritex(stdout, result);
  } else {
    save_file(dst_filename, result);
  }

  return 0;
}